

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppdVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pMVar6;
  bool bVar7;
  int iVar8;
  DiskType dt;
  int32_t num;
  double *i;
  long *plVar9;
  TSMuxer *this;
  TSMuxer *this_00;
  long lVar10;
  ostream *poVar11;
  undefined4 *puVar12;
  runtime_error *prVar13;
  size_type *psVar14;
  long *plVar15;
  pointer pdVar16;
  BlurayHelper *fileFactory;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  size_t idx;
  pointer pdVar22;
  long local_688;
  bool insertBlankPL;
  string subItemName;
  string local_650;
  string itemName;
  string isoDiskLabel;
  vector<double,_std::allocator<double>_> customChapterList;
  string fileExt2;
  int autoChapterLen;
  uint uStack_59c;
  ulong local_598;
  long local_590;
  long lStack_588;
  int blankNum;
  int firstM2tsOffset;
  int firstMplsOffset;
  IsoWriter *local_570;
  string fileExt_1;
  string fileExt;
  bool stereoMode;
  long local_500 [2];
  int local_4ec;
  uint *local_4e8;
  undefined8 local_4e0;
  uint local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  uint *local_4c8;
  undefined8 local_4c0;
  uint local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  ulong local_4a8;
  long local_4a0;
  string str;
  MPLSParser mplsParser;
  bool local_270;
  int64_t local_190;
  pointer local_158;
  pointer local_150;
  long local_e0;
  bool local_46;
  uint local_38;
  bool local_32;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tsMuxeR version git-c6b1186",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,". github.com/justdan96/tsMuxer",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  sLastMsg = true;
  firstMplsOffset = 0;
  firstM2tsOffset = 0;
  blankNum = 0x76c;
  insertBlankPL = false;
  if (argc != 2) {
    if (argc != 3) {
      showHelp();
      return -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mplsParser,argv[2],(allocator<char> *)&str);
    extractFileExt(&fileExt,(string *)&mplsParser);
    if ((bool *)mplsParser._0_8_ != &mplsParser.is_different_audios) {
      operator_delete((void *)mplsParser._0_8_,mplsParser._16_8_ + 1);
    }
    strToUpperCase((string *)&mplsParser,&fileExt);
    std::__cxx11::string::operator=((string *)&fileExt,(string *)&mplsParser);
    if ((bool *)mplsParser._0_8_ != &mplsParser.is_different_audios) {
      operator_delete((void *)mplsParser._0_8_,mplsParser._16_8_ + 1);
    }
    local_4a0 = std::chrono::_V2::steady_clock::now();
    _autoChapterLen = (long *)((ulong)uStack_59c << 0x20);
    customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _stereoMode = (long *)((ulong)_stereoMode & 0xffffffffffffff00);
    isoDiskLabel._M_dataplus._M_p = (pointer)&isoDiskLabel.field_2;
    isoDiskLabel._M_string_length = 0;
    isoDiskLabel.field_2._M_local_buf[0] = '\0';
    dt = checkBluRayMux(argv[1],&autoChapterLen,&customChapterList,&firstMplsOffset,&firstM2tsOffset
                        ,&insertBlankPL,&blankNum,&stereoMode,&isoDiskLabel);
    unquoteStr(&fileExt2,&fileExt);
    iVar8 = std::__cxx11::string::compare((char *)&fileExt2);
    if ((((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)&fileExt2), iVar8 == 0)) ||
        (iVar8 = std::__cxx11::string::compare((char *)&fileExt2), iVar8 == 0)) ||
       ((iVar8 = std::__cxx11::string::compare((char *)&fileExt2), dt != NONE || (iVar8 == 0)))) {
      BlurayHelper::BlurayHelper((BlurayHelper *)&fileExt_1);
      MuxerManager::MuxerManager
                ((MuxerManager *)&mplsParser,&readManager,&tsMuxerFactory.super_AbstractMuxerFactory
                );
      iVar8 = std::__cxx11::string::compare((char *)&fileExt2);
      MuxerManager::setAllowStereoMux((MuxerManager *)&mplsParser,dt != NONE || iVar8 == 0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,argv[1],(allocator<char> *)&itemName);
      MuxerManager::openMetaFile((MuxerManager *)&mplsParser,&str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)str._M_dataplus._M_p != &str.field_2) {
        operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
      }
      bVar7 = isV3();
      if ((dt == BLURAY && !bVar7) && (local_270 == true)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"HEVC stream detected: changing Blu-Ray version to V3.",
                   0x35);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        sLastMsg = true;
        V3_flags._0_1_ = (byte)V3_flags | 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,argv[2],(allocator<char> *)&subItemName);
      unquoteStr(&itemName,&str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)str._M_dataplus._M_p != &str.field_2) {
        operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
      }
      bVar7 = isValidFileName(&itemName);
      if (!bVar7) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        subItemName._M_dataplus._M_p = (pointer)&subItemName.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&subItemName,"Output filename is invalid: ","");
        std::operator+(&str,&subItemName,&itemName);
        std::runtime_error::runtime_error(prVar13,(string *)&str);
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (dt != NONE) {
        iVar8 = BlurayHelper::open((BlurayHelper *)&fileExt_1,(char *)&itemName,dt,local_190,
                                   (ulong)local_38,(ulong)local_32);
        if ((char)iVar8 == '\0') {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          subItemName._M_dataplus._M_p = (pointer)&subItemName.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&subItemName,"Can\'t create output file ","");
          std::operator+(&str,&subItemName,&itemName);
          std::runtime_error::runtime_error(prVar13,(string *)&str);
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        BlurayHelper::setVolumeLabel((BlurayHelper *)&fileExt_1,&isoDiskLabel);
        BlurayHelper::createBluRayDirs((BlurayHelper *)&fileExt_1);
        BlurayHelper::m2tsFileName_abi_cxx11_(&str,(BlurayHelper *)&fileExt_1,firstM2tsOffset);
        std::__cxx11::string::operator=((string *)&itemName,(string *)&str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
      }
      if ((int)((ulong)((long)local_150 - (long)local_158) >> 4) * -0xf0f0f0f == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&str,"No tracks selected",0x12);
        puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar12 = 3;
        *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
        if (local_4c8 == &local_4b8) {
          puVar12[6] = local_4b8;
          puVar12[7] = uStack_4b4;
          puVar12[8] = uStack_4b0;
          puVar12[9] = uStack_4ac;
        }
        else {
          *(uint **)(puVar12 + 2) = local_4c8;
          *(ulong *)(puVar12 + 6) = CONCAT44(uStack_4b4,local_4b8);
        }
        *(undefined8 *)(puVar12 + 4) = local_4c0;
        local_4c0 = 0;
        local_4b8 = local_4b8 & 0xffffff00;
        local_4c8 = &local_4b8;
        __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      fileFactory = (BlurayHelper *)0x0;
      if (dt != NONE) {
        fileFactory = (BlurayHelper *)&fileExt_1;
      }
      MuxerManager::doMux((MuxerManager *)&mplsParser,&itemName,&fileFactory->super_FileFactory);
      bVar7 = insertBlankPL;
      if (dt != NONE) {
        local_4a8 = (ulong)(uint)firstMplsOffset;
        local_4ec = blankNum;
        BlurayHelper::writeBluRayFiles
                  ((BlurayHelper *)&fileExt_1,(MuxerManager *)&mplsParser,insertBlankPL,
                   firstMplsOffset,blankNum,stereoMode);
        this = (TSMuxer *)MuxerManager::getMainMuxer((MuxerManager *)&mplsParser);
        if ((this == (TSMuxer *)0x0) ||
           ((this->super_AbstractMuxer)._vptr_AbstractMuxer != (_func_int **)&PTR__TSMuxer_00242648)
           ) {
          this = (TSMuxer *)0x0;
        }
        this_00 = (TSMuxer *)MuxerManager::getSubMuxer((MuxerManager *)&mplsParser);
        if ((this_00 == (TSMuxer *)0x0) ||
           ((this_00->super_AbstractMuxer)._vptr_AbstractMuxer !=
            (_func_int **)&PTR__TSMuxer_00242648)) {
          this_00 = (TSMuxer *)0x0;
        }
        if (this != (TSMuxer *)0x0) {
          iVar8 = TSMuxer::getFirstFileNum(this);
          BlurayHelper::createCLPIFile((BlurayHelper *)&fileExt_1,this,iVar8,true);
        }
        if (this_00 != (TSMuxer *)0x0) {
          iVar8 = TSMuxer::getFirstFileNum(this_00);
          BlurayHelper::createCLPIFile((BlurayHelper *)&fileExt_1,this_00,iVar8,false);
          local_570 = BlurayHelper::isoWriter((BlurayHelper *)&fileExt_1);
          if ((local_570 != (IsoWriter *)0x0) &&
             ((this->m_fileNames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->m_fileNames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
            idx = 0;
            do {
              TSMuxer::getFileNameByIdx_abi_cxx11_(&str,this,idx);
              TSMuxer::getFileNameByIdx_abi_cxx11_(&subItemName,this_00,idx);
              extractFileName(&local_650,&str);
              num = strToInt32(&local_650);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p != &local_650.field_2) {
                operator_delete(local_650._M_dataplus._M_p,
                                local_650.field_2._M_allocated_capacity + 1);
              }
              if ((str._M_string_length != 0) && (subItemName._M_string_length != 0)) {
                BlurayHelper::ssifFileName_abi_cxx11_(&local_650,(BlurayHelper *)&fileExt_1,num);
                IsoWriter::createInterleavedFile(local_570,&str,&subItemName,&local_650);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_650._M_dataplus._M_p != &local_650.field_2) {
                  operator_delete(local_650._M_dataplus._M_p,
                                  local_650.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subItemName._M_dataplus._M_p != &subItemName.field_2) {
                operator_delete(subItemName._M_dataplus._M_p,
                                subItemName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)str._M_dataplus._M_p != &str.field_2) {
                operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
              }
              idx = idx + 1;
            } while (idx < (ulong)((long)(this->m_fileNames).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_fileNames).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
        }
        if (customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pdVar22 = customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            *pdVar22 = *pdVar22 - (double)local_e0 / 5292000000.0;
            pdVar22 = pdVar22 + 1;
          } while (pdVar22 !=
                   customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        if (this_00 != (TSMuxer *)0x0) {
          TSMuxer::alignPTS(this,this_00);
        }
        BlurayHelper::createMPLSFile
                  ((BlurayHelper *)&fileExt_1,this,this_00,autoChapterLen,&customChapterList,dt,
                   (int)local_4a8,local_46);
        if ((bVar7 == true && this != (TSMuxer *)0x0) && this_00 == (TSMuxer *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Adding blank play list",0x16);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          sLastMsg = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&subItemName,*argv,(allocator<char> *)&local_650);
          extractFileDir(&str,&subItemName);
          muxBlankPL(&str,(BlurayHelper *)&fileExt_1,&(this->m_pmt).pidList,dt,local_4ec);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subItemName._M_dataplus._M_p != &subItemName.field_2) {
            operator_delete(subItemName._M_dataplus._M_p,
                            subItemName.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mux successful complete",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      sLastMsg = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)itemName._M_dataplus._M_p != &itemName.field_2) {
        operator_delete(itemName._M_dataplus._M_p,itemName.field_2._M_allocated_capacity + 1);
      }
      MuxerManager::~MuxerManager((MuxerManager *)&mplsParser);
      BlurayHelper::~BlurayHelper((BlurayHelper *)&fileExt_1);
      pcVar19 = "Muxing time: ";
      lVar21 = 0xd;
    }
    else {
      MuxerManager::MuxerManager
                ((MuxerManager *)&mplsParser,&readManager,
                 &singleFileMuxerFactory.super_AbstractMuxerFactory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,argv[1],(allocator<char> *)&fileExt_1);
      MuxerManager::openMetaFile((MuxerManager *)&mplsParser,&str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)str._M_dataplus._M_p != &str.field_2) {
        operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
      }
      if ((int)((ulong)((long)local_150 - (long)local_158) >> 4) * -0xf0f0f0f == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&str,"No tracks selected",0x12);
        puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar12 = 3;
        *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
        if (local_4e8 == &local_4d8) {
          puVar12[6] = local_4d8;
          puVar12[7] = uStack_4d4;
          puVar12[8] = uStack_4d0;
          puVar12[9] = uStack_4cc;
        }
        else {
          *(uint **)(puVar12 + 2) = local_4e8;
          *(ulong *)(puVar12 + 6) = CONCAT44(uStack_4d4,local_4d8);
        }
        *(undefined8 *)(puVar12 + 4) = local_4e0;
        local_4e0 = 0;
        local_4d8 = local_4d8 & 0xffffff00;
        local_4e8 = &local_4d8;
        __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileExt_1,argv[2],(allocator<char> *)&itemName);
      unquoteStr(&str,&fileExt_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileExt_1._M_dataplus._M_p != &fileExt_1.field_2) {
        operator_delete(fileExt_1._M_dataplus._M_p,fileExt_1.field_2._M_allocated_capacity + 1);
      }
      bVar7 = isValidFileName(&str);
      if (!bVar7) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        itemName._M_dataplus._M_p = (pointer)&itemName.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&itemName,"Output filename is invalid: ","");
        std::operator+(&fileExt_1,&itemName,&str);
        std::runtime_error::runtime_error(prVar13,(string *)&fileExt_1);
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      createDir(&str,true);
      MuxerManager::doMux((MuxerManager *)&mplsParser,&str,(FileFactory *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Demux complete.",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      sLastMsg = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)str._M_dataplus._M_p != &str.field_2) {
        operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
      }
      MuxerManager::~MuxerManager((MuxerManager *)&mplsParser);
      pcVar19 = "Demuxing time: ";
      lVar21 = 0xf;
    }
    lVar10 = std::chrono::_V2::steady_clock::now();
    lVar10 = lVar10 - local_4a0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar19,lVar21);
    sLastMsg = true;
    if (59999999999 < lVar10) {
      poVar11 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," min ",5);
    }
    sLastMsg = true;
    poVar11 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," sec",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    sLastMsg = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileExt2._M_dataplus._M_p != &fileExt2.field_2) {
      operator_delete(fileExt2._M_dataplus._M_p,fileExt2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)isoDiskLabel._M_dataplus._M_p != &isoDiskLabel.field_2) {
      operator_delete(isoDiskLabel._M_dataplus._M_p,
                      CONCAT71(isoDiskLabel.field_2._M_allocated_capacity._1_7_,
                               isoDiskLabel.field_2._M_local_buf[0]) + 1);
    }
    if (customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)customChapterList.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)customChapterList.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileExt._M_dataplus._M_p == &fileExt.field_2) {
      return 0;
    }
    goto LAB_00199c1a;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,argv[1],(allocator<char> *)&mplsParser);
  extractFileExt(&fileExt_1,&str);
  strToLowerCase((string *)&mplsParser,&fileExt_1);
  std::__cxx11::string::operator=((string *)&fileExt_1,(string *)&mplsParser);
  if ((bool *)mplsParser._0_8_ != &mplsParser.is_different_audios) {
    operator_delete((void *)mplsParser._0_8_,mplsParser._16_8_ + 1);
  }
  iVar8 = std::__cxx11::string::compare((char *)&fileExt_1);
  if ((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)&fileExt_1), iVar8 == 0)) {
    iVar8 = std::__cxx11::string::compare((char *)&fileExt_1);
    MPLSParser::MPLSParser(&mplsParser);
    MPLSParser::parse(&mplsParser,argv[1]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&isoDiskLabel,argv[1],(allocator<char> *)&fileExt2);
    getBlurayStreamDir(&fileExt,&isoDiskLabel);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)isoDiskLabel._M_dataplus._M_p != &isoDiskLabel.field_2) {
      operator_delete(isoDiskLabel._M_dataplus._M_p,
                      CONCAT71(isoDiskLabel.field_2._M_allocated_capacity._1_7_,
                               isoDiskLabel.field_2._M_local_buf[0]) + 1);
    }
    pcVar19 = ".m2ts";
    if (iVar8 == 0) {
      pcVar19 = ".MTS";
    }
    isoDiskLabel._M_dataplus._M_p = (pointer)&isoDiskLabel.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&isoDiskLabel,pcVar19,pcVar19 + ((ulong)(iVar8 == 0) ^ 5));
    pcVar19 = ".ssif";
    if (iVar8 == 0) {
      pcVar19 = ".SIF";
    }
    fileExt2._M_dataplus._M_p = (pointer)&fileExt2.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fileExt2,pcVar19,pcVar19 + ((ulong)(iVar8 == 0) ^ 5));
    pMVar6 = mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_570 = (IsoWriter *)CONCAT71(local_570._1_7_,mplsParser.isDependStreamExist);
    if (mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::operator+(&subItemName,&fileExt,
                     &(mplsParser.m_playItems.
                       super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                       super__Vector_impl_data._M_start)->fileName);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&subItemName,(ulong)isoDiskLabel._M_dataplus._M_p);
      psVar14 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar14) {
        itemName.field_2._M_allocated_capacity = *psVar14;
        itemName.field_2._8_8_ = plVar9[3];
        itemName._M_dataplus._M_p = (pointer)&itemName.field_2;
      }
      else {
        itemName.field_2._M_allocated_capacity = *psVar14;
        itemName._M_dataplus._M_p = (pointer)*plVar9;
      }
      itemName._M_string_length = plVar9[1];
      *plVar9 = (long)psVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      paVar1 = &subItemName.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subItemName._M_dataplus._M_p != paVar1) {
        operator_delete(subItemName._M_dataplus._M_p,subItemName.field_2._M_allocated_capacity + 1);
      }
      bVar7 = fileExists(&itemName);
      if (bVar7) {
        if (((char)local_570 != '\0') &&
           (mplsParser.m_mvcFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            mplsParser.m_mvcFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::operator+(&local_650,&fileExt,
                         mplsParser.m_mvcFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_650,(ulong)isoDiskLabel._M_dataplus._M_p);
          psVar14 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar14) {
            subItemName.field_2._M_allocated_capacity = *psVar14;
            subItemName.field_2._8_8_ = plVar9[3];
            subItemName._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            subItemName.field_2._M_allocated_capacity = *psVar14;
            subItemName._M_dataplus._M_p = (pointer)*plVar9;
          }
          subItemName._M_string_length = plVar9[1];
          *plVar9 = (long)psVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_650._M_dataplus._M_p != &local_650.field_2) {
            operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
          }
          bVar7 = fileExists(&subItemName);
          if (bVar7) {
            detectStreamReader(subItemName._M_dataplus._M_p,&mplsParser,true);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subItemName._M_dataplus._M_p != paVar1) {
            operator_delete(subItemName._M_dataplus._M_p,
                            subItemName.field_2._M_allocated_capacity + 1);
          }
          if (!bVar7) goto LAB_00199032;
        }
      }
      else {
LAB_00199032:
        _stereoMode = local_500;
        std::__cxx11::string::_M_construct<char_const*>((string *)&stereoMode,"SSIF","");
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&stereoMode,0,(char *)0x0,(ulong)fileExt._M_dataplus._M_p
                                   );
        plVar15 = plVar9 + 2;
        if ((long *)*plVar9 == plVar15) {
          local_590 = *plVar15;
          lStack_588 = plVar9[3];
          _autoChapterLen = &local_590;
        }
        else {
          local_590 = *plVar15;
          _autoChapterLen = (long *)*plVar9;
        }
        local_598 = plVar9[1];
        *plVar9 = (long)plVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        getDirSeparator();
        plVar9 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&autoChapterLen,local_598,0,'\x01');
        ppdVar2 = &customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pdVar22 = (pointer)(plVar9 + 2);
        if ((pointer)*plVar9 == pdVar22) {
          customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar22;
          customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)ppdVar2;
        }
        else {
          customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar22;
          customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar9;
        }
        customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar9[1];
        *plVar9 = (long)pdVar22;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&customChapterList,
                                    (ulong)(pMVar6->fileName)._M_dataplus._M_p);
        psVar14 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_650.field_2._M_allocated_capacity = *psVar14;
          local_650.field_2._8_8_ = plVar9[3];
          local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
        }
        else {
          local_650.field_2._M_allocated_capacity = *psVar14;
          local_650._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_650._M_string_length = plVar9[1];
        *plVar9 = (long)psVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_650,(ulong)fileExt2._M_dataplus._M_p);
        psVar14 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar14) {
          subItemName.field_2._M_allocated_capacity = *psVar14;
          subItemName.field_2._8_8_ = plVar9[3];
          subItemName._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          subItemName.field_2._M_allocated_capacity = *psVar14;
          subItemName._M_dataplus._M_p = (pointer)*plVar9;
        }
        subItemName._M_string_length = plVar9[1];
        *plVar9 = (long)psVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_650._M_dataplus._M_p != &local_650.field_2) {
          operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
        }
        if ((pointer *)
            customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != ppdVar2) {
          operator_delete(customChapterList.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)customChapterList.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (_autoChapterLen != &local_590) {
          operator_delete(_autoChapterLen,local_590 + 1);
        }
        if (_stereoMode != local_500) {
          operator_delete(_stereoMode,local_500[0] + 1);
        }
        bVar7 = fileExists(&subItemName);
        if (bVar7) {
          std::__cxx11::string::_M_assign((string *)&itemName);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)subItemName._M_dataplus._M_p != paVar1) {
          operator_delete(subItemName._M_dataplus._M_p,subItemName.field_2._M_allocated_capacity + 1
                         );
        }
      }
      detectStreamReader(itemName._M_dataplus._M_p,&mplsParser,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)itemName._M_dataplus._M_p != &itemName.field_2) {
        operator_delete(itemName._M_dataplus._M_p,itemName.field_2._M_allocated_capacity + 1);
      }
    }
    if (mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      paVar1 = &subItemName.field_2;
      uVar20 = 0;
      local_688 = 0;
      pdVar22 = (pointer)0x0;
      do {
        pMVar6 = mplsParser.m_playItems.
                 super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar17 = &local_650.field_2;
        itemName._M_dataplus._M_p = (pointer)&itemName.field_2;
        itemName._M_string_length = 0;
        itemName.field_2._M_allocated_capacity =
             itemName.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if ((char)local_570 == '\0') {
          pcVar19 = (char *)std::__cxx11::string::_M_append
                                      ((char *)&fileExt,
                                       (ulong)mplsParser.m_playItems.
                                              super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(long)pdVar22].fileName._M_dataplus._M_p);
          std::__cxx11::string::_M_append(pcVar19,(ulong)isoDiskLabel._M_dataplus._M_p);
          std::__cxx11::string::_M_assign((string *)&itemName);
        }
        else {
          _stereoMode = local_500;
          std::__cxx11::string::_M_construct<char_const*>((string *)&stereoMode,"SSIF","");
          plVar9 = (long *)std::__cxx11::string::replace
                                     ((ulong)&stereoMode,0,(char *)0x0,
                                      (ulong)fileExt._M_dataplus._M_p);
          _autoChapterLen = &local_590;
          plVar15 = plVar9 + 2;
          if ((long *)*plVar9 == plVar15) {
            local_590 = *plVar15;
            lStack_588 = plVar9[3];
          }
          else {
            local_590 = *plVar15;
            _autoChapterLen = (long *)*plVar9;
          }
          local_598 = plVar9[1];
          *plVar9 = (long)plVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          getDirSeparator();
          plVar9 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&autoChapterLen,local_598,0,'\x01');
          customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&customChapterList.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          pdVar16 = (pointer)(plVar9 + 2);
          if ((pointer)*plVar9 == pdVar16) {
            customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar16;
          }
          else {
            customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*pdVar16;
            customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar9;
          }
          customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar9[1];
          *plVar9 = (long)pdVar16;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&customChapterList,
                                      (ulong)pMVar6[(long)pdVar22].fileName._M_dataplus._M_p);
          psVar14 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_650.field_2._M_allocated_capacity = *psVar14;
            local_650.field_2._8_8_ = plVar9[3];
            local_650._M_dataplus._M_p = (pointer)paVar17;
          }
          else {
            local_650.field_2._M_allocated_capacity = *psVar14;
            local_650._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_650._M_string_length = plVar9[1];
          *plVar9 = (long)psVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_650);
          psVar14 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar14) {
            subItemName.field_2._M_allocated_capacity = *psVar14;
            subItemName.field_2._8_8_ = plVar9[3];
            subItemName._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            subItemName.field_2._M_allocated_capacity = *psVar14;
            subItemName._M_dataplus._M_p = (pointer)*plVar9;
          }
          subItemName._M_string_length = plVar9[1];
          *plVar9 = (long)psVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::operator=((string *)&itemName,(string *)&subItemName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subItemName._M_dataplus._M_p != paVar1) {
            operator_delete(subItemName._M_dataplus._M_p,
                            subItemName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_650._M_dataplus._M_p != paVar17) {
            operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
          }
          if ((pointer *)
              customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(customChapterList.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)customChapterList.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (_autoChapterLen != &local_590) {
            operator_delete(_autoChapterLen,local_590 + 1);
          }
          if (_stereoMode != local_500) {
            operator_delete(_stereoMode,local_500[0] + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        sLastMsg = true;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File #",6);
        customChapterList.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = pdVar22;
        int64ToStr_abi_cxx11_(&local_650,(int64_t *)&customChapterList);
        strPadLeft(&subItemName,&local_650,5,'0');
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,subItemName._M_dataplus._M_p,
                             subItemName._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," name=",6);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,itemName._M_dataplus._M_p,itemName._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)subItemName._M_dataplus._M_p != paVar1) {
          operator_delete(subItemName._M_dataplus._M_p,subItemName.field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_650._M_dataplus._M_p != paVar17) {
          operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
        }
        sLastMsg = true;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Duration: ",10);
        floatToTime_abi_cxx11_
                  (&subItemName,
                   (double)(mplsParser.m_playItems.
                            super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)pdVar22].OUT_time -
                           mplsParser.m_playItems.
                           super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pdVar22].IN_time) / 45000.0,'.');
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,subItemName._M_dataplus._M_p,
                             subItemName._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)subItemName._M_dataplus._M_p != paVar1) {
          operator_delete(subItemName._M_dataplus._M_p,subItemName.field_2._M_allocated_capacity + 1
                         );
        }
        sLastMsg = true;
        if (mplsParser.isDependStreamExist == true) {
          pcVar19 = "Base view: left-eye";
          if ((ulong)mplsParser.mvc_base_view_r != 0) {
            pcVar19 = "Base view: right-eye";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,pcVar19,(ulong)mplsParser.mvc_base_view_r + 0x13);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        sLastMsg = true;
        if (mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            mplsParser.m_playItems.super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"start-time: ",0xc);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
        }
        uVar18 = 0;
        if (uVar20 < (ulong)((long)mplsParser.m_marks.
                                   super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)mplsParser.m_marks.
                                   super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3)) {
          do {
            sLastMsg = true;
            uVar3 = mplsParser.m_marks.
                    super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar20].m_playItemID;
            if ((pointer)(ulong)uVar3 <= pdVar22) {
              uVar4 = mplsParser.m_marks.
                      super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar20].m_markTime;
              uVar5 = mplsParser.m_playItems.
                      super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pdVar22].IN_time;
              if (uVar18 * -0x33333333 + 0x19999999 < 0x33333333) {
                if (0 < (int)uVar18) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                  std::ostream::put(-0x28);
                  std::ostream::flush();
                }
                sLastMsg = true;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Marks: ",7);
              }
              sLastMsg = true;
              floatToTime_abi_cxx11_
                        (&subItemName,(double)(long)((ulong)(uVar4 - uVar5) + local_688) / 45000.0,
                         '.');
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,subItemName._M_dataplus._M_p,
                                   subItemName._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subItemName._M_dataplus._M_p != paVar1) {
                operator_delete(subItemName._M_dataplus._M_p,
                                subItemName.field_2._M_allocated_capacity + 1);
              }
              uVar18 = uVar18 + 1;
            }
          } while (((pointer)(ulong)uVar3 <= pdVar22) &&
                  (uVar20 = uVar20 + 1,
                  uVar20 < (ulong)((long)mplsParser.m_marks.
                                         super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)mplsParser.m_marks.
                                         super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3)));
          uVar18 = (uint)(0 < (int)uVar18);
        }
        sLastMsg = true;
        if ((char)uVar18 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        sLastMsg = true;
        uVar4 = mplsParser.m_playItems.
                super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pdVar22].OUT_time;
        uVar5 = mplsParser.m_playItems.
                super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pdVar22].IN_time;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)itemName._M_dataplus._M_p != &itemName.field_2) {
          operator_delete(itemName._M_dataplus._M_p,itemName.field_2._M_allocated_capacity + 1);
        }
        local_688 = local_688 + (ulong)(uVar4 - uVar5);
        pdVar22 = (pointer)((long)pdVar22 + 1);
      } while (pdVar22 < (pointer)(((long)mplsParser.m_playItems.
                                          super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)mplsParser.m_playItems.
                                          super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                  -0x5555555555555555));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileExt2._M_dataplus._M_p != &fileExt2.field_2) {
      operator_delete(fileExt2._M_dataplus._M_p,fileExt2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)isoDiskLabel._M_dataplus._M_p != &isoDiskLabel.field_2) {
      operator_delete(isoDiskLabel._M_dataplus._M_p,
                      CONCAT71(isoDiskLabel.field_2._M_allocated_capacity._1_7_,
                               isoDiskLabel.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileExt._M_dataplus._M_p != &fileExt.field_2) {
      operator_delete(fileExt._M_dataplus._M_p,fileExt.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&mplsParser.m_mvcFiles);
    if (mplsParser.m_marks.super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(mplsParser.m_marks.
                      super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)mplsParser.m_marks.
                            super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)mplsParser.m_marks.
                            super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector
              (&mplsParser.m_streamInfoMVC);
    std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector(&mplsParser.m_streamInfo);
    std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector(&mplsParser.m_playItems);
  }
  else {
    detectStreamReader(argv[1],(MPLSParser *)0x0,false);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileExt_1._M_dataplus._M_p != &fileExt_1.field_2) {
    operator_delete(fileExt_1._M_dataplus._M_p,fileExt_1.field_2._M_allocated_capacity + 1);
  }
  fileExt.field_2._M_allocated_capacity = str.field_2._M_allocated_capacity;
  fileExt._M_dataplus._M_p = str._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p == &str.field_2) {
    return 0;
  }
LAB_00199c1a:
  operator_delete(fileExt._M_dataplus._M_p,fileExt.field_2._M_allocated_capacity + 1);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
#ifdef _WIN32
    auto argvWide = CommandLineToArgvW(GetCommandLineW(), &argc);
    std::vector<std::string> argv_utf8;
    argv_utf8.reserve(static_cast<std::size_t>(argc));
    for (int i = 0; i < argc; ++i)
    {
        argv_utf8.emplace_back(toUtf8(argvWide[i]));
    }
    LocalFree(argvWide);
    std::vector<char*> argv_vec;
    argv_vec.reserve(argv_utf8.size());
    for (auto&& s : argv_utf8)
    {
        argv_vec.push_back(s.data());
    }
    argv = argv_vec.data();
#endif
    LTRACE(LT_INFO, 2, "tsMuxeR version " TSMUXER_VERSION << ". github.com/justdan96/tsMuxer");
    int firstMplsOffset = 0;
    int firstM2tsOffset = 0;
    int blankNum = 1900;
    bool insertBlankPL = false;
    // createBluRayDirs("c:/workshop/");

    // MPLSParser parser;
    // parser.parse("d:/hdtv/SHERLOCK_HOLMES/BDMV/PLAYLIST/00100.mpls");

    // CLPIParser parser;
    // parser.parse("h:/BDMV/CLIPINF/00000.clpi");
    // parser.parse("d:/workshop/test_orig_disk2/BDMV/CLIPINF/00003.clpi");

    // uint8_t moBuffer[1024];
    // MovieObject mo;
    // mo.parse("h:/BDMV/MovieObject.bdmv");
    // int moLen = mo.compose(moBuffer, sizeof(moBuffer));
    // file.write(moBuffer, moLen);

    try
    {
        if (argc == 2)
        {
            string str = argv[1];
            string fileExt = extractFileExt(str);
            fileExt = strToLowerCase(fileExt);
            if (fileExt == "mpls" || fileExt == "mpl")
            {
                bool shortExt = fileExt == "mpl";
                MPLSParser mplsParser;
                mplsParser.parse(argv[1]);
                string streamDir = getBlurayStreamDir(argv[1]);
                std::string mediaExt = shortExt ? ".MTS" : ".m2ts";
                std::string ssifExt = shortExt ? ".SIF" : ".ssif";
                bool mode3D = mplsParser.isDependStreamExist;
                bool switchToSsif = false;
                if (!mplsParser.m_playItems.empty())
                {
                    MPLSPlayItem& item = mplsParser.m_playItems[0];
                    string itemName = streamDir + item.fileName + mediaExt;
                    if (fileExists(itemName))
                    {
                        if (mode3D && !mplsParser.m_mvcFiles.empty())
                        {
                            string subItemName = streamDir + mplsParser.m_mvcFiles[0] + mediaExt;
                            if (fileExists(subItemName))
                                detectStreamReader(subItemName.c_str(), &mplsParser, true);
                            else
                                switchToSsif = true;
                        }
                    }
                    else
                    {
                        switchToSsif = true;
                    }
                    if (switchToSsif)
                    {
                        string ssifName = streamDir + string("SSIF") + getDirSeparator() + item.fileName + ssifExt;
                        if (fileExists(ssifName))
                            itemName = ssifName;  // if m2ts file absent then swith to ssif
                    }
                    detectStreamReader(itemName.c_str(), &mplsParser, false);
                }

                size_t markIndex = 0;
                int64_t prevFileOffset = 0;
                for (size_t i = 0; i < mplsParser.m_playItems.size(); i++)
                {
                    MPLSPlayItem& item = mplsParser.m_playItems[i];

                    string itemName;
                    if (mode3D)
                        itemName = streamDir + string("SSIF") + getDirSeparator() + item.fileName + ".ssif";
                    else
                        itemName = streamDir.append(item.fileName).append(mediaExt);  // 2d mode

                    LTRACE(LT_INFO, 2, "");
                    LTRACE(LT_INFO, 2, "File #" << strPadLeft(int64ToStr(i), 5, '0') << " name=" << itemName);
                    LTRACE(LT_INFO, 2,
                           "Duration: " << floatToTime(
                               (mplsParser.m_playItems[i].OUT_time - mplsParser.m_playItems[i].IN_time) /
                               (double)45000.0));
                    if (mplsParser.isDependStreamExist)
                    {
                        if (mplsParser.mvc_base_view_r)
                        {
                            LTRACE(LT_INFO, 2, "Base view: right-eye");
                        }
                        else
                        {
                            LTRACE(LT_INFO, 2, "Base view: left-eye");
                        }
                    }
                    if (!mplsParser.m_playItems.empty())
                        LTRACE(LT_INFO, 2, "start-time: " << mplsParser.m_playItems[0].IN_time);
                    int marksPerFile = 0;
                    for (; markIndex < mplsParser.m_marks.size(); markIndex++)
                    {
                        PlayListMark& curMark = mplsParser.m_marks[markIndex];
                        if (static_cast<unsigned>(curMark.m_playItemID) > i)
                            break;
                        uint64_t time = curMark.m_markTime - mplsParser.m_playItems[i].IN_time + prevFileOffset;
                        if (marksPerFile % 5 == 0)
                        {
                            if (marksPerFile > 0)
                                LTRACE(LT_INFO, 2, "");
                            LTRACE2(LT_INFO, "Marks: ")
                        }
                        marksPerFile++;
                        LTRACE2(LT_INFO, floatToTime((double)time / 45000.0) << " ")
                    }
                    if (marksPerFile > 0)
                        LTRACE(LT_INFO, 2, "");
                    prevFileOffset += mplsParser.m_playItems[i].OUT_time - mplsParser.m_playItems[i].IN_time;
                }
            }
            else
                detectStreamReader(argv[1], nullptr, false);
            cout << endl;
            return 0;
        }
        if (argc != 3)
        {
            /*
                        LTRACE(LT_INFO, 2, "Usage: ");
                        LTRACE(LT_INFO, 2, "For start muxing: " << "tsMuxeR <meta file name> <out file/dir name>");
                        LTRACE(LT_INFO, 2, "For detect stream params: " << "tsMuxeR <media file name>");
                        LTRACE(LT_INFO, 2, "For more information about meta file see readme.txt");
                        cout << endl;
            */
            showHelp();
            return -1;
        }
        string fileExt = extractFileExt(argv[2]);
        fileExt = strToUpperCase(fileExt);
        auto startTime = std::chrono::steady_clock::now();

        int autoChapterLen = 0;
        vector<double> customChapterList;
        bool stereoMode = false;
        string isoDiskLabel;
        DiskType dt = checkBluRayMux(argv[1], autoChapterLen, customChapterList, firstMplsOffset, firstM2tsOffset,
                                     insertBlankPL, blankNum, stereoMode, isoDiskLabel);
        std::string fileExt2 = unquoteStr(fileExt);
        bool muxMode =
            fileExt2 == "M2TS" || fileExt2 == "TS" || fileExt2 == "SSIF" || fileExt2 == "ISO" || dt != DiskType::NONE;

        if (muxMode)
        {
            BlurayHelper blurayHelper;

            MuxerManager muxerManager(readManager, tsMuxerFactory);
            muxerManager.setAllowStereoMux(fileExt2 == "SSIF" || dt != DiskType::NONE);
            muxerManager.openMetaFile(argv[1]);
            if (!isV3() && dt == DiskType::BLURAY && muxerManager.getHevcFound())
            {
                LTRACE(LT_INFO, 2, "HEVC stream detected: changing Blu-Ray version to V3.");
                V3_flags |= HDMV_V3;
            }

            // output path - is checked for invalid characters on our platform
            string dstFile = unquoteStr(argv[2]);

            if (!isValidFileName(dstFile))
                throw runtime_error(string("Output filename is invalid: ") + dstFile);

            if (dt != DiskType::NONE)
            {
                if (!blurayHelper.open(dstFile, dt, muxerManager.totalSize(), muxerManager.getExtraISOBlocks(),
                                       muxerManager.useReproducibleIsoHeader()))
                    throw runtime_error(string("Can't create output file ") + dstFile);
                blurayHelper.setVolumeLabel(isoDiskLabel);
                blurayHelper.createBluRayDirs();
                dstFile = blurayHelper.m2tsFileName(firstM2tsOffset);
            }
            if (muxerManager.getTrackCnt() == 0)
                THROW(ERR_COMMON, "No tracks selected")
            muxerManager.doMux(dstFile, dt != DiskType::NONE ? &blurayHelper : nullptr);
            if (dt != DiskType::NONE)
            {
                blurayHelper.writeBluRayFiles(muxerManager, insertBlankPL, firstMplsOffset, blankNum, stereoMode);
                auto mainMuxer = dynamic_cast<TSMuxer*>(muxerManager.getMainMuxer());
                auto subMuxer = dynamic_cast<TSMuxer*>(muxerManager.getSubMuxer());

                if (mainMuxer)
                    blurayHelper.createCLPIFile(mainMuxer, mainMuxer->getFirstFileNum(), true);
                if (subMuxer)
                {
                    blurayHelper.createCLPIFile(subMuxer, subMuxer->getFirstFileNum(), false);

                    IsoWriter* IsoWriter = blurayHelper.isoWriter();
                    if (IsoWriter)
                    {
                        for (size_t i = 0; i < mainMuxer->splitFileCnt(); ++i)
                        {
                            string file1 = mainMuxer->getFileNameByIdx(i);
                            string file2 = subMuxer->getFileNameByIdx(i);
                            int ssifNum = strToInt32(extractFileName(file1));
                            if (!file1.empty() && !file2.empty())
                                IsoWriter->createInterleavedFile(file1, file2, blurayHelper.ssifFileName(ssifNum));
                        }
                    }
                }

                for (auto& i : customChapterList)
                    i -= static_cast<double>(muxerManager.getCutStart()) / INTERNAL_PTS_FREQ;

                if (subMuxer)
                    mainMuxer->alignPTS(subMuxer);

                blurayHelper.createMPLSFile(mainMuxer, subMuxer, autoChapterLen, customChapterList, dt, firstMplsOffset,
                                            muxerManager.isMvcBaseViewR());

                if (insertBlankPL && mainMuxer && !subMuxer)
                {
                    LTRACE(LT_INFO, 2, "Adding blank play list");
                    muxBlankPL(extractFileDir(argv[0]), blurayHelper, mainMuxer->getPidList(), dt, blankNum);
                }
            }

            LTRACE(LT_INFO, 2, "Mux successful complete");
        }
        else
        {
            MuxerManager sMuxer(readManager, singleFileMuxerFactory);
            sMuxer.openMetaFile(argv[1]);
            if (sMuxer.getTrackCnt() == 0)
                THROW(ERR_COMMON, "No tracks selected")

            // output path - is checked for invalid characters on our platform
            string dstFile = unquoteStr(argv[2]);

            if (!isValidFileName(dstFile))
                throw runtime_error(string("Output filename is invalid: ") + dstFile);

            createDir(dstFile, true);
            sMuxer.doMux(dstFile, nullptr);
            LTRACE(LT_INFO, 2, "Demux complete.");
        }
        auto endTime = std::chrono::steady_clock::now();
        auto totalTime = endTime - startTime;
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(totalTime);
        auto minutes = std::chrono::duration_cast<std::chrono::minutes>(totalTime);
        if (muxMode)
        {
            LTRACE2(LT_INFO, "Muxing time: ")
        }
        else
            LTRACE2(LT_INFO, "Demuxing time: ")
        if (minutes.count() > 0)
        {
            LTRACE2(LT_INFO, minutes.count() << " min ")
            seconds -= minutes;
        }
        LTRACE(LT_INFO, 2, seconds.count() << " sec");

        return 0;
    }
    catch (runtime_error& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE2(LT_ERROR, e.what())
        return -1;
    }
    catch (VodCoreException& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, e.m_errStr.c_str());
        return -2;
    }
    catch (BitStreamException& e)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, "Bitstream exception " << e.what() << EXCEPTION_ERR_MSG);
        return -3;
    }
    catch (...)
    {
        if (argc == 2)
            LTRACE2(LT_ERROR, "Error: ")
        LTRACE(LT_ERROR, 2, "Unknnown exception" << EXCEPTION_ERR_MSG);
        return -4;
    }
}